

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

TimeZone * icu_63::TimeZone::createCustomTimeZone(UnicodeString *id)

{
  UBool UVar1;
  SimpleTimeZone *this;
  size_t size;
  SimpleTimeZone *local_98;
  int32_t offset;
  undefined1 local_68 [8];
  UnicodeString customID;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t sign;
  UnicodeString *id_local;
  
  _hour = id;
  UVar1 = parseCustomID(id,&min,&sec,(int32_t *)(customID.fUnion.fStackFields.fBuffer + 0x19),
                        (int32_t *)(customID.fUnion.fStackFields.fBuffer + 0x17));
  if (UVar1 == '\0') {
    id_local = (UnicodeString *)0x0;
  }
  else {
    UnicodeString::UnicodeString((UnicodeString *)local_68);
    size = (size_t)(uint)customID.fUnion._52_4_;
    formatCustomID(sec,customID.fUnion._52_4_,customID.fUnion._48_4_,(byte)((uint)min >> 0x1f),
                   (UnicodeString *)local_68);
    this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,size);
    local_98 = (SimpleTimeZone *)0x0;
    if (this != (SimpleTimeZone *)0x0) {
      SimpleTimeZone::SimpleTimeZone
                (this,min * ((sec * 0x3c + customID.fUnion._52_4_) * 0x3c + customID.fUnion._48_4_)
                      * 1000,(UnicodeString *)local_68);
      local_98 = this;
    }
    id_local = (UnicodeString *)local_98;
    UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return (TimeZone *)id_local;
}

Assistant:

TimeZone*
TimeZone::createCustomTimeZone(const UnicodeString& id)
{
    int32_t sign, hour, min, sec;
    if (parseCustomID(id, sign, hour, min, sec)) {
        UnicodeString customID;
        formatCustomID(hour, min, sec, (sign < 0), customID);
        int32_t offset = sign * ((hour * 60 + min) * 60 + sec) * 1000;
        return new SimpleTimeZone(offset, customID);
    }
    return NULL;
}